

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign.cpp
# Opt level: O2

float ncnn::bilinear_interpolate(float *ptr,int w,int h,float x,float y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  iVar2 = (int)x;
  iVar3 = iVar2 + 1;
  iVar4 = (int)y + 1;
  fVar6 = 0.0;
  if (iVar3 < w) {
    fVar5 = x - (float)(int)x;
  }
  else {
    fVar5 = 0.0;
  }
  fVar8 = 1.0;
  if (iVar3 < w) {
    fVar7 = (float)iVar3 - x;
  }
  else {
    fVar7 = 1.0;
    iVar3 = w + -1;
  }
  iVar1 = h + -1;
  if (iVar4 < h) {
    fVar8 = (float)iVar4 - y;
    fVar6 = y - (float)(int)y;
    iVar1 = iVar4;
  }
  iVar4 = (int)y * w;
  return (fVar5 * ptr[iVar1 * w + iVar3] + fVar7 * ptr[iVar2 + iVar1 * w]) * fVar6 +
         (ptr[iVar4 + iVar3] * fVar5 + ptr[iVar4 + iVar2] * fVar7) * fVar8;
}

Assistant:

static inline float bilinear_interpolate(const float* ptr, int w, int h, float x, float y)
{
    int x0 = (int)x;
    int x1 = x0 + 1;
    int y0 = (int)y;
    int y1 = y0 + 1;

    float a0 = x1 - x;
    float a1 = x - x0;
    float b0 = y1 - y;
    float b1 = y - y0;

    if (x1 >= w)
    {
        x1 = w - 1;
        a0 = 1.f;
        a1 = 0.f;
    }
    if (y1 >= h)
    {
        y1 = h - 1;
        b0 = 1.f;
        b1 = 0.f;
    }

    float r0 = ptr[y0 * w + x0] * a0 + ptr[y0 * w + x1] * a1;
    float r1 = ptr[y1 * w + x0] * a0 + ptr[y1 * w + x1] * a1;

    float v = r0 * b0 + r1 * b1;

    return v;
}